

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commandline.cpp
# Opt level: O1

StringList * __thiscall
CommandLine::process(StringList *__return_storage_ptr__,CommandLine *this,int argc,char **argv)

{
  CommandLineOption *this_00;
  size_t __n;
  int iVar1;
  CommandLineOption **ppCVar2;
  string *this_01;
  int iVar3;
  char **ppcVar4;
  bool bVar5;
  String name;
  String value;
  String arg;
  undefined1 *local_110;
  size_t local_108;
  undefined1 local_100 [16];
  char *local_f0;
  undefined8 local_e8;
  char local_e0 [16];
  String local_d0;
  char **local_b0;
  String local_a8;
  int local_84;
  List<CommandLineOption_*> *local_80;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  
  (__return_storage_ptr__->super_List<String>)._deque.
  super__Deque_base<String,_std::allocator<String>_>._M_impl.super__Deque_impl_data._M_finish.
  _M_last = (_Elt_pointer)0x0;
  (__return_storage_ptr__->super_List<String>)._deque.
  super__Deque_base<String,_std::allocator<String>_>._M_impl.super__Deque_impl_data._M_finish.
  _M_node = (_Map_pointer)0x0;
  (__return_storage_ptr__->super_List<String>)._deque.
  super__Deque_base<String,_std::allocator<String>_>._M_impl.super__Deque_impl_data._M_finish._M_cur
       = (_Elt_pointer)0x0;
  (__return_storage_ptr__->super_List<String>)._deque.
  super__Deque_base<String,_std::allocator<String>_>._M_impl.super__Deque_impl_data._M_finish.
  _M_first = (_Elt_pointer)0x0;
  (__return_storage_ptr__->super_List<String>)._deque.
  super__Deque_base<String,_std::allocator<String>_>._M_impl.super__Deque_impl_data._M_start._M_last
       = (_Elt_pointer)0x0;
  (__return_storage_ptr__->super_List<String>)._deque.
  super__Deque_base<String,_std::allocator<String>_>._M_impl.super__Deque_impl_data._M_start._M_node
       = (_Map_pointer)0x0;
  (__return_storage_ptr__->super_List<String>)._deque.
  super__Deque_base<String,_std::allocator<String>_>._M_impl.super__Deque_impl_data._M_start._M_cur
       = (_Elt_pointer)0x0;
  (__return_storage_ptr__->super_List<String>)._deque.
  super__Deque_base<String,_std::allocator<String>_>._M_impl.super__Deque_impl_data._M_start.
  _M_first = (_Elt_pointer)0x0;
  (__return_storage_ptr__->super_List<String>)._deque.
  super__Deque_base<String,_std::allocator<String>_>._M_impl.super__Deque_impl_data._M_map =
       (_Map_pointer)0x0;
  (__return_storage_ptr__->super_List<String>)._deque.
  super__Deque_base<String,_std::allocator<String>_>._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_b0 = argv;
  local_80 = &this->_options;
  std::_Deque_base<String,_std::allocator<String>_>::_M_initialize_map
            ((_Deque_base<String,_std::allocator<String>_> *)__return_storage_ptr__,0);
  if (1 < argc) {
    local_84 = argc + -1;
    iVar3 = 1;
    do {
      std::__cxx11::string::string((string *)&local_a8,local_b0[iVar3],(allocator *)&local_110);
      local_110 = local_100;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"--","");
      __n = CONCAT44(local_a8._string._M_string_length._4_4_,(int)local_a8._string._M_string_length)
      ;
      if (__n == local_108) {
        if (__n == 0) {
          bVar5 = true;
        }
        else {
          iVar1 = bcmp(local_a8._string._M_dataplus._M_p,local_110,__n);
          bVar5 = iVar1 == 0;
        }
      }
      else {
        bVar5 = false;
      }
      if (local_110 != local_100) {
        operator_delete(local_110);
      }
      if (bVar5) {
        iVar3 = iVar3 + 1;
        bVar5 = true;
        if (iVar3 < argc) {
          ppcVar4 = local_b0 + iVar3;
          do {
            std::__cxx11::string::string((string *)&local_110,*ppcVar4,(allocator *)&local_f0);
            std::deque<String,_std::allocator<String>_>::push_back
                      ((deque<String,_std::allocator<String>_> *)__return_storage_ptr__,
                       (value_type *)&local_110);
            if (local_110 != local_100) {
              operator_delete(local_110);
            }
            ppcVar4 = ppcVar4 + 1;
            iVar3 = iVar3 + 1;
          } while (argc != iVar3);
        }
      }
      else if (*local_a8._string._M_dataplus._M_p == '-') {
        if (local_a8._string._M_dataplus._M_p[1] == '-') {
          local_110 = local_100;
          local_108 = 0;
          local_100[0] = 0;
          local_f0 = local_e0;
          local_e8 = 0;
          local_e0[0] = '\0';
          iVar1 = String::firstIndexOf(&local_a8,"=",2);
          if (iVar1 == -1) {
            String::mid(&local_d0,&local_a8,2,-1);
            this_01 = (string *)&local_110;
          }
          else {
            String::mid(&local_d0,&local_a8,2,(long)iVar1);
            std::__cxx11::string::operator=((string *)&local_110,(string *)&local_d0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d0._string._M_dataplus._M_p != &local_d0._string.field_2) {
              operator_delete(local_d0._string._M_dataplus._M_p);
            }
            String::mid(&local_d0,&local_a8,(long)(iVar1 + 1),-1);
            this_01 = (string *)&local_f0;
          }
          std::__cxx11::string::operator=(this_01,(string *)&local_d0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._string._M_dataplus._M_p != &local_d0._string.field_2) {
            operator_delete(local_d0._string._M_dataplus._M_p);
          }
          local_58._8_8_ = 0;
          pcStack_40 = std::
                       _Function_handler<bool_(CommandLineOption_*const_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/TarCV[P]botc/src/commandline.cpp:123:51)>
                       ::_M_invoke;
          local_48 = std::
                     _Function_handler<bool_(CommandLineOption_*const_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/TarCV[P]botc/src/commandline.cpp:123:51)>
                     ::_M_manager;
          local_58._M_unused._0_8_ = (string *)&local_110;
          ppCVar2 = List<CommandLineOption_*>::find
                              (local_80,(function<bool_(CommandLineOption_*const_&)> *)&local_58);
          if (local_48 != (code *)0x0) {
            (*local_48)(&local_58,&local_58,__destroy_functor);
          }
          if (ppCVar2 == (CommandLineOption **)0x0) {
            error<String>("unknown option --%1",(String *)&local_110);
          }
          if (((*ppCVar2)->_type == (type_info *)&bool::typeinfo) && (*local_f0 != '\0')) {
            CommandLineOption::describe(&local_d0,*ppCVar2);
            error<String>("option %1 does not take a value",&local_d0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d0._string._M_dataplus._M_p != &local_d0._string.field_2) {
              operator_delete(local_d0._string._M_dataplus._M_p);
            }
          }
          (*(*ppCVar2)->_vptr_CommandLineOption[2])(*ppCVar2,&local_f0);
          if (local_f0 != local_e0) {
            operator_delete(local_f0);
          }
          if (local_110 != local_100) {
            operator_delete(local_110);
          }
        }
        else {
          if (local_a8._string._M_dataplus._M_p[1] == '\0') goto LAB_0011068f;
          local_f0 = (char *)CONCAT44(local_f0._4_4_,1);
          if (1 < (int)local_a8._string._M_string_length) {
            do {
              local_78._8_8_ = &local_f0;
              pcStack_60 = std::
                           _Function_handler<bool_(CommandLineOption_*const_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/TarCV[P]botc/src/commandline.cpp:74:52)>
                           ::_M_invoke;
              local_68 = std::
                         _Function_handler<bool_(CommandLineOption_*const_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/TarCV[P]botc/src/commandline.cpp:74:52)>
                         ::_M_manager;
              local_78._M_unused._M_object = &local_a8;
              ppCVar2 = List<CommandLineOption_*>::find
                                  (local_80,(function<bool_(CommandLineOption_*const_&)> *)&local_78
                                  );
              if (local_68 != (code *)0x0) {
                (*local_68)(&local_78,&local_78,__destroy_functor);
              }
              if (ppCVar2 == (CommandLineOption **)0x0) {
                error<char>("unknown option -%1",local_a8._string._M_dataplus._M_p + (int)local_f0);
              }
              this_00 = *ppCVar2;
              if (this_00->_type == (type_info *)&bool::typeinfo) {
                local_110 = local_100;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"");
                (*this_00->_vptr_CommandLineOption[2])(this_00,(string *)&local_110);
                if (local_110 != local_100) {
                  operator_delete(local_110);
                }
              }
              else {
                if (iVar3 == local_84) {
                  CommandLineOption::describe((String *)&local_110,this_00);
                  error<String>("option -%1 requires a parameter",(String *)&local_110);
                  if (local_110 != local_100) {
                    operator_delete(local_110);
                  }
                }
                if ((int)local_f0 != (int)local_a8._string._M_string_length + -1) {
                  CommandLineOption::describe((String *)&local_110,this_00);
                  error<String,char>("option %1 requires a parameter but has option -%2 stacked on",
                                     (String *)&local_110,
                                     local_a8._string._M_dataplus._M_p + (long)(int)local_f0 + 1);
                  if (local_110 != local_100) {
                    operator_delete(local_110);
                  }
                }
                std::__cxx11::string::string
                          ((string *)&local_110,local_b0[(long)iVar3 + 1],(allocator *)&local_d0);
                (*this_00->_vptr_CommandLineOption[2])(this_00,(string *)&local_110);
                if (local_110 != local_100) {
                  operator_delete(local_110);
                }
                iVar3 = iVar3 + 1;
              }
              iVar1 = (int)local_f0 + 1;
              local_f0 = (char *)CONCAT44(local_f0._4_4_,iVar1);
            } while (iVar1 < (int)local_a8._string._M_string_length);
          }
        }
        bVar5 = false;
      }
      else {
LAB_0011068f:
        bVar5 = false;
        std::deque<String,_std::allocator<String>_>::push_back
                  ((deque<String,_std::allocator<String>_> *)__return_storage_ptr__,&local_a8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._string._M_dataplus._M_p != &local_a8._string.field_2) {
        operator_delete(local_a8._string._M_dataplus._M_p);
      }
    } while ((!bVar5) && (iVar3 = iVar3 + 1, iVar3 < argc));
  }
  return __return_storage_ptr__;
}

Assistant:

StringList CommandLine::process (int const argc, char* argv[])
{
	StringList args;

	for (int argn = 1; argn < argc; ++argn)
	{
		String const arg (argv[argn]);

		if (arg == "--")
		{
			// terminating option - write everything to args and be done with it.
			while (++argn < argc)
				args << argv[argn];

			break;
		}

		if (arg[0] != '-' or arg[1] == '\0')
		{
			// non-option argument - pass to result
			args << arg;
			continue;
		}

		if (arg[1] != '-' and arg[1] != '\0')
		{
			// short-form options
			for (int i = 1; i < arg.length(); ++i)
			{
				CommandLineOption** optionptr = _options.find ([&](CommandLineOption* const& a)
				{
					return arg[i] == a->shortform();
				});

				if (not optionptr)
					error ("unknown option -%1", arg[i]);

				CommandLineOption* option = *optionptr;

				if (option->isOfType<bool>())
				{
					// Bool options need no parameters
					option->handleValue ("");
				}
				else
				{
					// Ensure we got a valid parameter coming up
					if (argn == argc - 1)
						error ("option -%1 requires a parameter", option->describe());

					if (i != arg.length() - 1)
					{
						error ("option %1 requires a parameter but has option -%2 stacked on",
							option->describe(), arg[i + 1]);
					}

					option->handleValue (argv[++argn]);
				}
			}
		}
		else
		{
			// long-form options
			String name, value;
			{
				int idx = arg.firstIndexOf ("=", 2);

				if (idx != -1)
				{
					name = arg.mid (2, idx);
					value = arg.mid (idx + 1);
				}
				else
				{
					name = arg.mid (2);
				}
			}

			CommandLineOption** optionptr = _options.find ([&](CommandLineOption* const& a)
			{
				return a->longform() == name;
			});

			if (not optionptr)
				error ("unknown option --%1", name);

			if ((*optionptr)->isOfType<bool>() and not value.isEmpty())
				error ("option %1 does not take a value", (*optionptr)->describe());
 
			(*optionptr)->handleValue (value);
		}
	}

	return args;
}